

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VLinearSumVectorArray(int nvec,realtype a,N_Vector *X,realtype b,N_Vector *Y,N_Vector *Z)

{
  int local_3c;
  int i;
  N_Vector *Z_local;
  N_Vector *Y_local;
  realtype b_local;
  N_Vector *X_local;
  realtype a_local;
  int nvec_local;
  
  if ((*Z)->ops->nvlinearsumvectorarray ==
      (_func_int_int_realtype_N_Vector_ptr_realtype_N_Vector_ptr_N_Vector_ptr *)0x0) {
    for (local_3c = 0; local_3c < nvec; local_3c = local_3c + 1) {
      (*(*Z)->ops->nvlinearsum)(a,X[local_3c],b,Y[local_3c],Z[local_3c]);
    }
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = (*(*Z)->ops->nvlinearsumvectorarray)(nvec,a,X,b,Y,Z);
  }
  return a_local._4_4_;
}

Assistant:

int N_VLinearSumVectorArray(int nvec, realtype a, N_Vector* X,
                            realtype b, N_Vector* Y, N_Vector* Z)
{
  int i;

  if (Z[0]->ops->nvlinearsumvectorarray != NULL) {
    
    return(Z[0]->ops->nvlinearsumvectorarray(nvec, a, X, b, Y, Z));

  } else {

    for (i=0; i<nvec; i++) {
      Z[0]->ops->nvlinearsum(a, X[i], b, Y[i], Z[i]);
    }
    return(0);

  }
}